

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O0

void __thiscall soul::IdentifierPath::IdentifierPath(IdentifierPath *this,Identifier i)

{
  IdentifierPath *this_local;
  Identifier i_local;
  
  ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation(&this->pathSections);
  addSuffix(this,i);
  return;
}

Assistant:

explicit IdentifierPath (Identifier i) { addSuffix (i); }